

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

void av1_rc_set_frame_target(AV1_COMP *cpi,int target,int width,int height)

{
  int iVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  (cpi->rc).this_frame_target = target;
  iVar1 = (cpi->common).width;
  if ((((iVar1 != (cpi->common).superres_upscaled_width) || (iVar1 != (cpi->common).render_width))
      || ((cpi->common).superres_upscaled_height != (cpi->common).render_height)) &&
     ((cpi->oxcf).rc_cfg.mode != AOM_CBR)) {
    dVar5 = ((double)((cpi->oxcf).frm_dim_cfg.height * (cpi->oxcf).frm_dim_cfg.width) /
            (double)(height * width)) * (double)target;
    dVar4 = 2147483647.0;
    if (dVar5 <= 2147483647.0) {
      dVar4 = dVar5;
    }
    target = (int)dVar4;
    (cpi->rc).this_frame_target = target;
  }
  lVar2 = ((long)target << 0xc) / (long)(height * width);
  lVar3 = 0x7fffffff;
  if (lVar2 < 0x7fffffff) {
    lVar3 = lVar2;
  }
  (cpi->rc).sb64_target_rate = (int)lVar3;
  return;
}

Assistant:

void av1_rc_set_frame_target(AV1_COMP *cpi, int target, int width, int height) {
  const AV1_COMMON *const cm = &cpi->common;
  RATE_CONTROL *const rc = &cpi->rc;

  rc->this_frame_target = target;

  // Modify frame size target when down-scaled.
  if (av1_frame_scaled(cm) && cpi->oxcf.rc_cfg.mode != AOM_CBR) {
    rc->this_frame_target = saturate_cast_double_to_int(
        rc->this_frame_target *
        resize_rate_factor(&cpi->oxcf.frm_dim_cfg, width, height));
  }

  // Target rate per SB64 (including partial SB64s.
  const int64_t sb64_target_rate =
      ((int64_t)rc->this_frame_target << 12) / (width * height);
  rc->sb64_target_rate = (int)AOMMIN(sb64_target_rate, INT_MAX);
}